

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

void __thiscall
OpenMesh::IO::_PLYReader_::readValue(_PLYReader_ *this,ValueType _type,istream *_in,uint *_value)

{
  bool bVar1;
  ostream *this_00;
  void *this_01;
  byte local_2f;
  ushort local_2e;
  uint local_2c;
  uint8_t tmp_uchar;
  uint16_t tmp_uint16_t;
  uint *puStack_28;
  uint32_t tmp_uint32_t;
  uint *_value_local;
  istream *_in_local;
  _PLYReader_ *p_Stack_10;
  ValueType _type_local;
  _PLYReader_ *this_local;
  
  puStack_28 = _value;
  _value_local = (uint *)_in;
  _in_local._4_4_ = _type;
  p_Stack_10 = this;
  if (_type - ValueTypeUINT8 < 2) {
    bVar1 = Options::check(&this->options_,2);
    restore<unsigned_char>(_in,&local_2f,bVar1);
    *puStack_28 = (uint)local_2f;
  }
  else if (_type - ValueTypeUINT16 < 2) {
    bVar1 = Options::check(&this->options_,2);
    restore<unsigned_short>(_in,&local_2e,bVar1);
    *puStack_28 = (uint)local_2e;
  }
  else if (_type == ValueTypeUINT32 || _type == ValueTypeUINT) {
    bVar1 = Options::check(&this->options_,2);
    restore<unsigned_int>(_in,&local_2c,bVar1);
    *puStack_28 = local_2c;
  }
  else {
    *_value = 0;
    this_00 = std::operator<<((ostream *)&std::cerr,"unsupported conversion type to unsigned int: ")
    ;
    this_01 = (void *)std::ostream::operator<<(this_00,_in_local._4_4_);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void _PLYReader_::readValue(ValueType _type, std::istream& _in, unsigned int& _value) const {

    uint32_t tmp_uint32_t;
    uint16_t tmp_uint16_t;
    uint8_t tmp_uchar;

    switch (_type) {

        case ValueTypeUINT:

        case ValueTypeUINT32:

            restore(_in, tmp_uint32_t, options_.check(Options::MSB));
            _value = tmp_uint32_t;

        break;

        case ValueTypeUSHORT:

        case ValueTypeUINT16:

            restore(_in, tmp_uint16_t, options_.check(Options::MSB));
            _value = tmp_uint16_t;

            break;

        case ValueTypeUCHAR:

        case ValueTypeUINT8:

            restore(_in, tmp_uchar, options_.check(Options::MSB));
            _value = tmp_uchar;

            break;

        default:

            _value = 0;
            std::cerr << "unsupported conversion type to unsigned int: " << _type << std::endl;

            break;
    }
}